

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRFormatInformation.cpp
# Opt level: O3

FormatInformation ZXing::QRCode::FormatInformation::DecodeMQR(uint32_t formatInfoBits)

{
  ErrorCorrectionLevel EVar1;
  uint uVar2;
  ulong uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  FormatInformation FVar5;
  allocator_type local_62;
  allocator_type local_61;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  uint local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  uint32_t local_28;
  uint local_24;
  
  local_44 = 0x4445;
  __l._M_len = 1;
  __l._M_array = &local_44;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__l,&local_61);
  uVar2 = formatInfoBits >> 0x18 | (formatInfoBits & 0xff0000) >> 8 | (formatInfoBits & 0xff00) << 8
          | formatInfoBits << 0x18;
  uVar2 = (uVar2 & 0xf0f0f0f) << 4 | uVar2 >> 4 & 0xf0f0f0f;
  uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333) * 4;
  local_24 = (uVar2 >> 1 & 0x55540000) + (uVar2 & 0x55550000) * 2 >> 0x11;
  __l_00._M_len = 2;
  __l_00._M_array = &local_28;
  local_28 = formatInfoBits;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,__l_00,&local_62);
  pvVar4 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  FVar5 = FindBestFormatInfo((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             local_60.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             local_60.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish);
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    pvVar4 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (pvVar4 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    operator_delete(pvVar4,(long)local_60.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  uVar2 = FVar5._4_4_ >> 2 & 7;
  EVar1 = ECLevelFromBits(uVar2,true);
  uVar3 = 0;
  if ((FVar5._0_8_ & 0xff000000000000) == 0x1000000000000) {
    uVar3 = 0x100000000000000;
  }
  uVar3 = FVar5._0_8_ & 0xffffffffffffff | uVar3;
  FVar5._8_8_ = (ulong)(byte)(&DAT_001a08b0)[uVar2] << 8 |
                CONCAT44(EVar1,FVar5._8_4_) & 0xffffffffffff0000 | (ulong)(FVar5._4_4_ & 3);
  FVar5.mask = (int)uVar3;
  FVar5.data = (char)(uVar3 >> 0x20);
  FVar5.hammingDistance = (char)(uVar3 >> 0x28);
  FVar5.bitsIndex = (char)(uVar3 >> 0x30);
  FVar5.isMirrored = (bool)(char)(uVar3 >> 0x38);
  return FVar5;
}

Assistant:

FormatInformation FormatInformation::DecodeMQR(uint32_t formatInfoBits)
{
	auto fi = FindBestFormatInfo({FORMAT_INFO_MASK_MICRO}, {formatInfoBits, MirrorBits(formatInfoBits)});

	constexpr uint8_t BITS_TO_VERSION[] = {1, 2, 2, 3, 3, 4, 4, 4};

	// Bits 2/3/4 contain both error correction level and version, 0/1 contain mask.
	fi.ecLevel = ECLevelFromBits((fi.data >> 2) & 0x07, true);
	fi.dataMask = static_cast<uint8_t>(fi.data & 0x03);
	fi.microVersion = BITS_TO_VERSION[(fi.data >> 2) & 0x07];
	fi.isMirrored = fi.bitsIndex == 1;

	return fi;
}